

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void __thiscall djb::tab_r::tab_r(tab_r *this,vector<float,_std::allocator<float>_> *ndf)

{
  impl *piVar1;
  
  (this->super_radial).super_microfacet.super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001ffcb0;
  piVar1 = (impl *)operator_new(8);
  piVar1->_vptr_impl = (_func_int **)&PTR_clone_00209af0;
  (this->super_radial).super_microfacet.m_fresnel.m_f = piVar1;
  (this->super_radial).super_microfacet.super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001ffd30;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_ndf,ndf);
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  configure(this);
  return;
}

Assistant:

tab_r::tab_r(const std::vector<float_t> &ndf):
	radial(fresnel::ideal<1>()), m_ndf(ndf)
{
	configure();
}